

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

int Ptex::v2_4::PtexUtils::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_ECX;
  void *in_RDX;
  int iVar1;
  int in_R8D;
  int in_R9D;
  char *end;
  char *dptr;
  char *sptr;
  void *local_38;
  EVP_PKEY_CTX *local_30;
  
  iVar1 = (int)src;
  if ((iVar1 == in_R9D) && (in_ECX == in_R9D)) {
    local_30 = (EVP_PKEY_CTX *)memcpy(in_RDX,dst,(long)(in_R8D * in_R9D));
  }
  else {
    local_38 = in_RDX;
    for (local_30 = dst; local_30 != dst + in_R8D * iVar1; local_30 = local_30 + iVar1) {
      memcpy(local_38,local_30,(long)in_R9D);
      local_38 = (void *)((long)local_38 + (long)in_ECX);
    }
  }
  return (int)local_30;
}

Assistant:

void copy(const void* src, int sstride, void* dst, int dstride,
          int vres, int rowlen)
{
    // regular non-tiled case
    if (sstride == rowlen && dstride == rowlen) {
        // packed case - copy in single block
        memcpy(dst, src, vres*rowlen);
    } else {
        // copy a row at a time
        const char* sptr = (const char*) src;
        char* dptr = (char*) dst;
        for (const char* end = sptr + vres*sstride; sptr != end;) {
            memcpy(dptr, sptr, rowlen);
            dptr += dstride;
            sptr += sstride;
        }
    }
}